

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  short sVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  undefined4 uVar13;
  ulong uVar14;
  ushort uVar15;
  uint uVar16;
  size_t u;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (bmi2 != 0) {
    ZSTD_buildFSETable_body_bmi2
              (dt,normalizedCounter,maxSymbolValue,baseValue,nbAdditionalBits,tableLog,wksp,wkspSize
              );
    return;
  }
  bVar2 = (byte)tableLog;
  uVar12 = 1 << (bVar2 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar7 = maxSymbolValue + 1;
  lVar6 = (long)wksp + 0x6a;
  uVar8 = uVar12 - 1;
  uVar13 = 1;
  uVar19 = 0;
  uVar10 = uVar8;
  do {
    uVar15 = normalizedCounter[uVar19];
    if (uVar15 == 0xffff) {
      uVar11 = (ulong)uVar10;
      uVar10 = uVar10 - 1;
      dt[uVar11 + 1].baseValue = (U32)uVar19;
      uVar15 = 1;
    }
    else {
      if ((short)uVar15 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if ((0x10000 << (bVar2 - 1 & 0x1f)) >> 0x10 <= (int)(uint)uVar15) {
        uVar13 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar19 * 2) = uVar15;
    uVar19 = uVar19 + 1;
  } while (uVar7 != uVar19);
  dt->nextState = (short)uVar13;
  dt->nbAdditionalBits = (char)((uint)uVar13 >> 0x10);
  dt->nbBits = (char)((uint)uVar13 >> 0x18);
  dt->baseValue = tableLog;
  auVar4 = _DAT_001e9030;
  auVar3 = _DAT_001e8fc0;
  if (uVar10 == uVar8) {
    iVar18 = (uVar12 >> 3) + (uVar12 >> 1) + 3;
    uVar19 = 0;
    lVar9 = 0;
    lVar17 = 0;
    do {
      uVar15 = normalizedCounter[uVar19];
      *(long *)(lVar6 + lVar9) = lVar17;
      if (8 < (long)(short)uVar15) {
        uVar10 = 0x10;
        if (0x10 < uVar15) {
          uVar10 = (int)(short)uVar15;
        }
        uVar14 = (ulong)(uVar10 & 0xffff) - 9;
        auVar22._8_4_ = (int)uVar14;
        auVar22._0_8_ = uVar14;
        auVar22._12_4_ = (int)(uVar14 >> 0x20);
        auVar20._0_8_ = uVar14 >> 3;
        auVar20._8_8_ = auVar22._8_8_ >> 3;
        auVar20 = auVar20 ^ auVar4;
        uVar11 = 0;
        do {
          auVar21._8_4_ = (int)uVar11;
          auVar21._0_8_ = uVar11;
          auVar21._12_4_ = (int)(uVar11 >> 0x20);
          auVar22 = (auVar21 | auVar3) ^ auVar4;
          if ((bool)(~(auVar20._4_4_ < auVar22._4_4_ ||
                      auVar20._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar20._4_4_) & 1)) {
            *(long *)(lVar6 + lVar9 + 8 + uVar11 * 8) = lVar17;
          }
          if (auVar22._12_4_ <= auVar20._12_4_ &&
              (auVar22._8_4_ <= auVar20._8_4_ || auVar22._12_4_ != auVar20._12_4_)) {
            *(long *)(lVar6 + lVar9 + 0x10 + uVar11 * 8) = lVar17;
          }
          uVar11 = uVar11 + 2;
        } while (((uVar14 >> 3) + 2 & 0xfffffffffffffffe) != uVar11);
      }
      if ((short)uVar15 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar9 = lVar9 + (short)uVar15;
      uVar19 = uVar19 + 1;
      lVar17 = lVar17 + 0x101010101010101;
    } while (uVar19 != uVar7 + (uVar7 == 0));
    if ((uVar12 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar19 = 0;
    uVar10 = 0;
    do {
      lVar9 = 0;
      uVar7 = uVar10;
      do {
        dt[(ulong)(uVar7 & uVar8) + 1].baseValue = (uint)*(byte *)(lVar6 + lVar9);
        lVar9 = lVar9 + 1;
        uVar7 = uVar7 + iVar18;
      } while (lVar9 == 1);
      uVar10 = uVar10 + iVar18 * 2 & uVar8;
      uVar19 = uVar19 + 2;
      lVar6 = lVar6 + 2;
    } while (uVar19 < uVar12);
    if (uVar10 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar19 = 0;
    uVar11 = 0;
    do {
      sVar1 = normalizedCounter[uVar19];
      if (0 < sVar1) {
        iVar18 = 0;
        do {
          dt[uVar11 + 1].baseValue = (U32)uVar19;
          do {
            uVar16 = (int)uVar11 + (uVar12 >> 1) + (uVar12 >> 3) + 3 & uVar8;
            uVar11 = (ulong)uVar16;
          } while (uVar10 < uVar16);
          iVar18 = iVar18 + 1;
        } while (iVar18 != sVar1);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar7 + (uVar7 == 0));
    if ((int)uVar11 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar19 = 0;
  while( true ) {
    uVar11 = (ulong)dt[uVar19 + 1].baseValue;
    uVar15 = *(ushort *)((long)wksp + uVar11 * 2);
    *(ushort *)((long)wksp + uVar11 * 2) = uVar15 + 1;
    iVar18 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> iVar18 == 0; iVar18 = iVar18 + -1) {
      }
    }
    bVar5 = bVar2 - (char)iVar18;
    dt[uVar19 + 1].nbBits = bVar5;
    dt[uVar19 + 1].nextState = (uVar15 << (bVar5 & 0x1f)) - (short)uVar12;
    if (nbAdditionalBits[uVar11] == 0xff) break;
    dt[uVar19 + 1].nbAdditionalBits = nbAdditionalBits[uVar11];
    dt[uVar19 + 1].baseValue = baseValue[uVar11];
    uVar19 = uVar19 + 1;
    if (uVar12 == uVar19) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}